

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::BeginGlobal
          (BinaryReaderIR *this,Index index,Type type,bool mutable_)

{
  Module *this_00;
  pointer pGVar1;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> local_58;
  Global *local_50;
  Global *global;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> local_28;
  unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> field;
  bool mutable__local;
  Index index_local;
  BinaryReaderIR *this_local;
  Type type_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl._3_1_ = mutable_;
  field._M_t.
  super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl._4_4_ = index;
  this_local._0_4_ = type.enum_;
  GetLocation((Location *)&global,this);
  MakeUnique<wabt::GlobalModuleField,wabt::Location>((wabt *)&local_28,(Location *)&global);
  pGVar1 = std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
           operator->(&local_28);
  local_50 = &pGVar1->global;
  (pGVar1->global).type.enum_ = this_local._0_4_;
  (pGVar1->global).mutable_ =
       (bool)(field._M_t.
              super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
              .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl._3_1_ & 1);
  this_00 = this->module_;
  std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
  unique_ptr(&local_58,&local_28);
  Module::AppendField(this_00,&local_58);
  std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
  ~unique_ptr(&local_58);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>::
  ~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::BeginGlobal(Index index, Type type, bool mutable_) {
  auto field = MakeUnique<GlobalModuleField>(GetLocation());
  Global& global = field->global;
  global.type = type;
  global.mutable_ = mutable_;
  module_->AppendField(std::move(field));
  return Result::Ok;
}